

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::accessChainStore
          (TGlslangToSpvTraverser *this,TType *type,Id rvalue)

{
  bool bVar1;
  int iVar2;
  Id IVar3;
  Id op3;
  Id IVar4;
  CoherentFlags CVar5;
  uint uVar6;
  Decoration nonUniform;
  MemoryAccessMask MVar7;
  MemoryAccessMask b;
  Scope scope;
  AccessChain local_158;
  AccessChain local_100;
  uint local_a4;
  CoherentFlags local_a0;
  uint alignment;
  AccessChain local_98;
  CoherentFlags local_40;
  Id local_3c;
  CoherentFlags coherentFlags;
  Id zero_1;
  Id one_1;
  Id bvecType;
  int vecSize;
  Id zero;
  Id one;
  Id boolType;
  Id nominalTypeId;
  Id rvalue_local;
  TType *type_local;
  TGlslangToSpvTraverser *this_local;
  
  iVar2 = (*type->_vptr_TType[7])();
  boolType = rvalue;
  if (iVar2 == 0xc) {
    IVar3 = spv::Builder::accessChainGetInferredType(&this->builder);
    bVar1 = spv::Builder::isScalarType(&this->builder,IVar3);
    if (bVar1) {
      IVar4 = spv::Builder::makeBoolType(&this->builder);
      if (IVar3 == IVar4) {
        IVar3 = spv::Builder::getTypeId(&this->builder,rvalue);
        if (IVar3 != IVar4) {
          IVar3 = spv::Builder::makeUintConstant(&this->builder,0,false);
          boolType = spv::Builder::createBinOp(&this->builder,OpINotEqual,IVar4,rvalue,IVar3);
        }
      }
      else {
        IVar4 = spv::Builder::makeUintConstant(&this->builder,1,false);
        op3 = spv::Builder::makeUintConstant(&this->builder,0,false);
        boolType = spv::Builder::createTriOp(&this->builder,OpSelect,IVar3,rvalue,IVar4,op3);
      }
    }
    else {
      bVar1 = spv::Builder::isVectorType(&this->builder,IVar3);
      if (bVar1) {
        uVar6 = spv::Builder::getNumTypeComponents(&this->builder,IVar3);
        IVar4 = spv::Builder::makeBoolType(&this->builder);
        IVar4 = spv::Builder::makeVectorType(&this->builder,IVar4,uVar6);
        if (IVar3 == IVar4) {
          IVar3 = spv::Builder::getTypeId(&this->builder,rvalue);
          if (IVar3 != IVar4) {
            IVar3 = spv::Builder::makeUintConstant(&this->builder,0,false);
            IVar3 = makeSmearedConstant(this,IVar3,uVar6);
            boolType = spv::Builder::createBinOp(&this->builder,OpINotEqual,IVar4,rvalue,IVar3);
          }
        }
        else {
          IVar4 = spv::Builder::makeUintConstant(&this->builder,1,false);
          coherentFlags = (CoherentFlags)makeSmearedConstant(this,IVar4,uVar6);
          IVar4 = spv::Builder::makeUintConstant(&this->builder,0,false);
          local_3c = makeSmearedConstant(this,IVar4,uVar6);
          boolType = spv::Builder::createTriOp
                               (&this->builder,OpSelect,IVar3,rvalue,(Id)coherentFlags,local_3c);
        }
      }
    }
  }
  spv::Builder::getAccessChain(&local_98,&this->builder);
  local_40 = local_98.coherentFlags;
  spv::Builder::AccessChain::~AccessChain(&local_98);
  CVar5 = TranslateCoherent(this,type);
  alignment._0_2_ = CVar5._0_2_;
  local_a0 = spv::Builder::AccessChain::CoherentFlags::operator|=
                       (&local_40,(CoherentFlags *)&alignment);
  spv::Builder::getAccessChain(&local_100,&this->builder);
  spv::Builder::AccessChain::~AccessChain(&local_100);
  local_a4 = local_100.alignment;
  uVar6 = glslang::TType::getBufferReferenceAlignment(type);
  local_a4 = uVar6 | local_a4;
  spv::Builder::getAccessChain(&local_158,&this->builder);
  nonUniform = TranslateNonUniformDecoration(this,&local_158.coherentFlags);
  MVar7 = TranslateMemoryAccess(this,&local_40);
  b = spv::operator~(MakePointerVisible);
  MVar7 = spv::operator&(MVar7,b);
  scope = TranslateMemoryScope(this,&local_40);
  spv::Builder::accessChainStore(&this->builder,boolType,nonUniform,MVar7,scope,local_a4);
  spv::Builder::AccessChain::~AccessChain(&local_158);
  return;
}

Assistant:

void TGlslangToSpvTraverser::accessChainStore(const glslang::TType& type, spv::Id rvalue)
{
    // Need to convert to abstract types when necessary
    if (type.getBasicType() == glslang::EbtBool) {
        spv::Id nominalTypeId = builder.accessChainGetInferredType();

        if (builder.isScalarType(nominalTypeId)) {
            // Conversion for bool
            spv::Id boolType = builder.makeBoolType();
            if (nominalTypeId != boolType) {
                // keep these outside arguments, for determinant order-of-evaluation
                spv::Id one = builder.makeUintConstant(1);
                spv::Id zero = builder.makeUintConstant(0);
                rvalue = builder.createTriOp(spv::OpSelect, nominalTypeId, rvalue, one, zero);
            } else if (builder.getTypeId(rvalue) != boolType)
                rvalue = builder.createBinOp(spv::OpINotEqual, boolType, rvalue, builder.makeUintConstant(0));
        } else if (builder.isVectorType(nominalTypeId)) {
            // Conversion for bvec
            int vecSize = builder.getNumTypeComponents(nominalTypeId);
            spv::Id bvecType = builder.makeVectorType(builder.makeBoolType(), vecSize);
            if (nominalTypeId != bvecType) {
                // keep these outside arguments, for determinant order-of-evaluation
                spv::Id one = makeSmearedConstant(builder.makeUintConstant(1), vecSize);
                spv::Id zero = makeSmearedConstant(builder.makeUintConstant(0), vecSize);
                rvalue = builder.createTriOp(spv::OpSelect, nominalTypeId, rvalue, one, zero);
            } else if (builder.getTypeId(rvalue) != bvecType)
                rvalue = builder.createBinOp(spv::OpINotEqual, bvecType, rvalue,
                                             makeSmearedConstant(builder.makeUintConstant(0), vecSize));
        }
    }

    spv::Builder::AccessChain::CoherentFlags coherentFlags = builder.getAccessChain().coherentFlags;
    coherentFlags |= TranslateCoherent(type);

    unsigned int alignment = builder.getAccessChain().alignment;
    alignment |= type.getBufferReferenceAlignment();

    builder.accessChainStore(rvalue, TranslateNonUniformDecoration(builder.getAccessChain().coherentFlags),
                             spv::MemoryAccessMask(TranslateMemoryAccess(coherentFlags) &
                                ~spv::MemoryAccessMakePointerVisibleKHRMask),
                             TranslateMemoryScope(coherentFlags), alignment);
}